

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::OptionBase<CLI::Option>::group(OptionBase<CLI::Option> *this,string *name)

{
  bool bVar1;
  undefined8 uVar2;
  string *in_RSI;
  Option *in_RDI;
  string *in_stack_00000008;
  IncorrectConstruction *in_stack_00000010;
  allocator local_31;
  string *in_stack_ffffffffffffffd0;
  
  bVar1 = detail::valid_alias_name_string(in_stack_ffffffffffffffd0);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffd0,
               "Group names may not contain newlines or null characters",&local_31);
    IncorrectConstruction::IncorrectConstruction(in_stack_00000010,in_stack_00000008);
    __cxa_throw(uVar2,&IncorrectConstruction::typeinfo,IncorrectConstruction::~IncorrectConstruction
               );
  }
  ::std::__cxx11::string::operator=((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

CRTP *group(const std::string &name) {
        if(!detail::valid_alias_name_string(name)) {
            throw IncorrectConstruction("Group names may not contain newlines or null characters");
        }
        group_ = name;
        return static_cast<CRTP *>(this);
    }